

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TranslatorFederate.cpp
# Opt level: O0

TranslatorInfo * __thiscall
helics::TranslatorFederate::getTranslatorInfo
          (TranslatorFederate *this,GlobalFederateId fed,InterfaceHandle handle)

{
  bool bVar1;
  TranslatorInfo *pTVar2;
  InterfaceHandle in_EDX;
  BaseType in_ESI;
  BaseType *in_RDI;
  GlobalHandle in_stack_ffffffffffffffe0;
  GlobalBrokerId in_stack_ffffffffffffffe8;
  undefined4 uVar3;
  GlobalFederateId local_4;
  
  uVar3 = 0;
  local_4.gid = in_ESI;
  bVar1 = GlobalFederateId::operator==(&local_4,(GlobalBrokerId)0x0);
  if (!bVar1) {
    in_stack_ffffffffffffffe8.gid = in_RDI[1];
    bVar1 = GlobalFederateId::operator==(&local_4,in_stack_ffffffffffffffe8);
    if (!bVar1) goto LAB_005b1172;
  }
  local_4.gid = *in_RDI;
LAB_005b1172:
  GlobalHandle::GlobalHandle((GlobalHandle *)&stack0xffffffffffffffe0,local_4,in_EDX);
  pTVar2 = gmlc::containers::MappedPointerVector<helics::TranslatorInfo,_helics::GlobalHandle>::find
                     ((MappedPointerVector<helics::TranslatorInfo,_helics::GlobalHandle> *)
                      CONCAT44(uVar3,in_stack_ffffffffffffffe8.gid),
                      (GlobalHandle *)in_stack_ffffffffffffffe0);
  return pTVar2;
}

Assistant:

TranslatorInfo* TranslatorFederate::getTranslatorInfo(GlobalFederateId fed, InterfaceHandle handle)
{
    if (fed == parent_broker_id || fed == mCoreID) {
        fed = mFedID;
    }
    return translators.find(GlobalHandle{fed, handle});
}